

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_c.h
# Opt level: O2

c_v256 * c_v256_unpack_s16_s32(c_v256 *__return_storage_ptr__,c_v128 a)

{
  uint64_t uVar1;
  c_v128 cVar2;
  c_v128 cVar3;
  
  uVar1 = a.u64[1];
  cVar2.u64[1] = uVar1;
  cVar2.u64[0] = (uint64_t)__return_storage_ptr__;
  cVar2 = c_v128_unpackhi_s16_s32(cVar2);
  cVar3.u64[1] = uVar1;
  cVar3.u64[0] = a.u64[0];
  cVar3 = c_v128_unpacklo_s16_s32(cVar3);
  __return_storage_ptr__->v128[1] = cVar2;
  __return_storage_ptr__->v128[0] = cVar3;
  return __return_storage_ptr__;
}

Assistant:

SIMD_INLINE c_v256 c_v256_unpack_s16_s32(c_v128 a) {
  return c_v256_from_v128(c_v128_unpackhi_s16_s32(a),
                          c_v128_unpacklo_s16_s32(a));
}